

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall Client::Receive(Client *this,int socket)

{
  ssize_t sVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  string msg;
  char buff [1024];
  long *local_438;
  long local_430;
  long local_428 [2];
  undefined1 local_418 [1024];
  
  memset(local_418,0,0x400);
  sVar1 = recv(this->client_sock,local_418,0x400,0);
  if (-1 < (int)sVar1) {
    local_438 = local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"");
    std::__cxx11::string::_M_append((char *)&local_438,(ulong)(this->collocutor)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_438);
    std::__cxx11::string::append((char *)&local_438);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_438,local_430);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_438 != local_428) {
      operator_delete(local_438,local_428[0] + 1);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Error of receiving!";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

void Client::Receive(int socket) {
    char buff[1024];
    memset(&buff, '\0', sizeof(buff));

    int __receive__ = recv(client_sock, buff, 1024, 0);

    if (__receive__ < 0) {
        throw "Error of receiving!";
        std::cout << "[!] Message has not received!" << std::endl;
        return;
    }

    std::string msg = "";

    msg += this->collocutor;
    msg += "> ";
    msg += buff;

    std::cout << msg << std::endl;
}